

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  int iVar6;
  ImU32 IVar7;
  GetterYs<unsigned_int> *pGVar8;
  TransformerLinLog *pTVar9;
  ImPlotPlot *pIVar10;
  GetterYRef *pGVar11;
  ImDrawVert *pIVar12;
  uint *puVar13;
  ImPlotContext *pIVar14;
  ImPlotContext *pIVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  double dVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  pIVar14 = GImPlot;
  pGVar8 = this->Getter1;
  dVar2 = pGVar8->XScale;
  dVar3 = pGVar8->X0;
  pTVar9 = this->Transformer;
  iVar6 = pGVar8->Count;
  dVar20 = log10((double)*(uint *)((long)pGVar8->Ys +
                                  (long)(((prim + pGVar8->Offset) % iVar6 + iVar6) % iVar6) *
                                  (long)pGVar8->Stride) /
                 GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  pIVar15 = GImPlot;
  iVar6 = pTVar9->YAxis;
  pIVar10 = pIVar14->CurrentPlot;
  dVar4 = pIVar10->YAxis[iVar6].Range.Min;
  fVar21 = (float)(((dVar2 * (double)prim + dVar3) - (pIVar10->XAxis).Range.Min) * pIVar14->Mx +
                  (double)pIVar14->PixelRange[iVar6].Min.x);
  fVar17 = (float)((((double)(float)(dVar20 / pIVar14->LogDenY[iVar6]) *
                     (pIVar10->YAxis[iVar6].Range.Max - dVar4) + dVar4) - dVar4) *
                   pIVar14->My[iVar6] + (double)pIVar14->PixelRange[iVar6].Min.y);
  pGVar11 = this->Getter2;
  dVar2 = pGVar11->XScale;
  dVar3 = pGVar11->X0;
  pTVar9 = this->Transformer;
  dVar20 = log10(pGVar11->YRef / GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  iVar6 = pTVar9->YAxis;
  pIVar10 = pIVar15->CurrentPlot;
  dVar4 = pIVar10->YAxis[iVar6].Range.Min;
  fVar22 = (float)((((double)prim * dVar2 + dVar3) - (pIVar10->XAxis).Range.Min) * pIVar15->Mx +
                  (double)pIVar15->PixelRange[iVar6].Min.x);
  fVar23 = (float)((((double)(float)(dVar20 / pIVar15->LogDenY[iVar6]) *
                     (pIVar10->YAxis[iVar6].Range.Max - dVar4) + dVar4) - dVar4) *
                   pIVar15->My[iVar6] + (double)pIVar15->PixelRange[iVar6].Min.y);
  fVar18 = fVar17;
  if (fVar23 <= fVar17) {
    fVar18 = fVar23;
  }
  bVar16 = false;
  if ((fVar18 < (cull_rect->Max).y) &&
     (fVar18 = (float)(~-(uint)(fVar23 <= fVar17) & (uint)fVar23 |
                      -(uint)(fVar23 <= fVar17) & (uint)fVar17), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar18 && fVar18 != *pfVar1)) {
    fVar18 = fVar21;
    if (fVar22 <= fVar21) {
      fVar18 = fVar22;
    }
    bVar16 = false;
    if (fVar18 < (cull_rect->Max).x) {
      fVar18 = (float)(~-(uint)(fVar22 <= fVar21) & (uint)fVar22 |
                      -(uint)(fVar22 <= fVar21) & (uint)fVar21);
      bVar16 = (cull_rect->Min).x <= fVar18 && fVar18 != (cull_rect->Min).x;
    }
  }
  if (bVar16 != false) {
    fVar18 = this->Weight;
    IVar7 = this->Col;
    IVar5 = *uv;
    fVar24 = fVar22 - fVar21;
    fVar25 = fVar23 - fVar17;
    fVar19 = fVar24 * fVar24 + fVar25 * fVar25;
    if (0.0 < fVar19) {
      if (fVar19 < 0.0) {
        fVar19 = sqrtf(fVar19);
      }
      else {
        fVar19 = SQRT(fVar19);
      }
      fVar24 = fVar24 * (1.0 / fVar19);
      fVar25 = fVar25 * (1.0 / fVar19);
    }
    fVar18 = fVar18 * 0.5;
    fVar24 = fVar24 * fVar18;
    fVar18 = fVar18 * fVar25;
    pIVar12 = DrawList->_VtxWritePtr;
    (pIVar12->pos).x = fVar18 + fVar21;
    (pIVar12->pos).y = fVar17 - fVar24;
    pIVar12->uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar7;
    pIVar12[1].pos.x = fVar18 + fVar22;
    pIVar12[1].pos.y = fVar23 - fVar24;
    pIVar12[1].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar7;
    pIVar12[2].pos.x = fVar22 - fVar18;
    pIVar12[2].pos.y = fVar24 + fVar23;
    pIVar12[2].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar7;
    pIVar12[3].pos.x = fVar21 - fVar18;
    pIVar12[3].pos.y = fVar24 + fVar17;
    pIVar12[3].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    puVar13 = DrawList->_IdxWritePtr;
    *puVar13 = DrawList->_VtxCurrentIdx;
    puVar13[1] = DrawList->_VtxCurrentIdx + 1;
    puVar13[2] = DrawList->_VtxCurrentIdx + 2;
    puVar13[3] = DrawList->_VtxCurrentIdx;
    puVar13[4] = DrawList->_VtxCurrentIdx + 2;
    puVar13[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar13 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  return bVar16;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }